

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGStatesPtr *ppxVar1;
  uint uVar2;
  xmlRelaxNGStatesPtr pxVar3;
  int iVar4;
  xmlRelaxNGValidStatePtr *ppxVar5;
  xmlRelaxNGValidStatePtr state;
  ulong uVar6;
  xmlRelaxNGStatesPtr states;
  ulong uVar7;
  xmlRelaxNGStatesPtr states_00;
  xmlRelaxNGStatesPtr states_01;
  long lVar8;
  xmlRelaxNGValidStatePtr *ppxVar9;
  long lVar10;
  uint local_54;
  
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  ppxVar1 = &ctxt->states;
  pxVar3 = ctxt->states;
  if (pxVar3 != (xmlRelaxNGStatesPtr)0x0) {
    iVar4 = pxVar3->nbState;
    if (iVar4 != 1) {
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
      ppxVar9 = &ctxt->state;
      uVar2 = ctxt->flags;
      ctxt->flags = uVar2 | 1;
      local_54 = 0;
      states_00 = (xmlRelaxNGStatesPtr)0x0;
      for (lVar10 = 0; lVar10 < iVar4; lVar10 = lVar10 + 1) {
        ctxt->state = pxVar3->tabState[lVar10];
        ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        iVar4 = xmlRelaxNGValidateState(ctxt,define);
        state = ctxt->state;
        if (state == (xmlRelaxNGValidStatePtr)0x0) {
LAB_0017d57a:
          state = (xmlRelaxNGValidStatePtr)0x0;
        }
        else if (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0) {
          xmlRelaxNGFreeValidState(ctxt,state);
          ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
          goto LAB_0017d57a;
        }
        ppxVar5 = ppxVar9;
        if (iVar4 == 0) {
          states_01 = *ppxVar1;
          if (states_01 == (xmlRelaxNGStatesPtr)0x0) {
            if (states_00 == (xmlRelaxNGStatesPtr)0x0) {
              lVar8 = (long)(int)local_54;
              local_54 = local_54 + 1;
              pxVar3->tabState[lVar8] = state;
              states_00 = (xmlRelaxNGStatesPtr)0x0;
            }
            else {
              xmlRelaxNGAddStates(ctxt,states_00,state);
            }
            goto LAB_0017d699;
          }
          if (states_00 != (xmlRelaxNGStatesPtr)0x0) {
            states = states_01;
            for (lVar8 = 0; lVar8 < states->nbState; lVar8 = lVar8 + 1) {
              xmlRelaxNGAddStates(ctxt,states_00,states->tabState[lVar8]);
              states = ctxt->states;
            }
            goto LAB_0017d60f;
          }
          *ppxVar1 = (xmlRelaxNGStatesPtr)0x0;
          uVar7 = 0;
          if (0 < (int)local_54) {
            uVar7 = (ulong)local_54;
          }
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            xmlRelaxNGAddStates(ctxt,states_01,pxVar3->tabState[uVar6]);
          }
        }
        else {
          if (state == (xmlRelaxNGValidStatePtr)0x0) {
            states = *ppxVar1;
            states_01 = states_00;
            if (states == (xmlRelaxNGStatesPtr)0x0) goto LAB_0017d69d;
            for (lVar8 = 0; lVar8 < states->nbState; lVar8 = lVar8 + 1) {
              xmlRelaxNGFreeValidState(ctxt,states->tabState[lVar8]);
              states = ctxt->states;
            }
LAB_0017d60f:
            xmlRelaxNGFreeStates(ctxt,states);
            ppxVar5 = (xmlRelaxNGValidStatePtr *)ppxVar1;
          }
          else {
            xmlRelaxNGFreeValidState(ctxt,state);
          }
LAB_0017d699:
          *ppxVar5 = (xmlRelaxNGValidStatePtr)0x0;
          states_01 = states_00;
        }
LAB_0017d69d:
        iVar4 = pxVar3->nbState;
        states_00 = states_01;
      }
      ctxt->flags = uVar2;
      if (states_00 == (xmlRelaxNGStatesPtr)0x0) {
        if (1 < (int)local_54) {
          pxVar3->nbState = local_54;
          *ppxVar1 = pxVar3;
          goto LAB_0017d6f2;
        }
        if (local_54 == 1) {
          ctxt->state = *pxVar3->tabState;
          xmlRelaxNGFreeStates(ctxt,pxVar3);
          goto LAB_0017d6f2;
        }
        xmlRelaxNGFreeStates(ctxt,pxVar3);
        iVar4 = -1;
        if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else {
        xmlRelaxNGFreeStates(ctxt,pxVar3);
        ctxt->states = states_00;
LAB_0017d6f2:
        iVar4 = 0;
      }
      if (*ppxVar9 == (xmlRelaxNGValidStatePtr)0x0) {
        return iVar4;
      }
      if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
        return iVar4;
      }
      xmlRelaxNGFreeValidState(ctxt,*ppxVar9);
      goto LAB_0017d715;
    }
    ctxt->state = *pxVar3->tabState;
    xmlRelaxNGFreeStates(ctxt,pxVar3);
    ctxt->states = (xmlRelaxNGStatesPtr)0x0;
  }
  iVar4 = xmlRelaxNGValidateState(ctxt,define);
  if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
    if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
      return iVar4;
    }
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  pxVar3 = *ppxVar1;
  if (pxVar3 == (xmlRelaxNGStatesPtr)0x0) {
    return iVar4;
  }
  if (pxVar3->nbState != 1) {
    return iVar4;
  }
  ctxt->state = *pxVar3->tabState;
  xmlRelaxNGFreeStates(ctxt,pxVar3);
  ppxVar9 = (xmlRelaxNGValidStatePtr *)ppxVar1;
LAB_0017d715:
  *ppxVar9 = (xmlRelaxNGValidStatePtr)0x0;
  return iVar4;
}

Assistant:

static int
xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    xmlRelaxNGStatesPtr states, res;
    int i, j, k, ret, oldflags;

    /*
     * We should NOT have both ctxt->state and ctxt->states
     */
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }

    if ((ctxt->states == NULL) || (ctxt->states->nbState == 1)) {
        if (ctxt->states != NULL) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        ret = xmlRelaxNGValidateState(ctxt, define);
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if ((ctxt->states != NULL) && (ctxt->states->nbState == 1)) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        return (ret);
    }

    states = ctxt->states;
    ctxt->states = NULL;
    res = NULL;
    j = 0;
    oldflags = ctxt->flags;
    ctxt->flags |= FLAGS_IGNORABLE;
    for (i = 0; i < states->nbState; i++) {
        ctxt->state = states->tabState[i];
        ctxt->states = NULL;
        ret = xmlRelaxNGValidateState(ctxt, define);
        /*
         * We should NOT have both ctxt->state and ctxt->states
         */
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if (ret == 0) {
            if (ctxt->states == NULL) {
                if (res != NULL) {
                    /* add the state to the container */
                    xmlRelaxNGAddStates(ctxt, res, ctxt->state);
                    ctxt->state = NULL;
                } else {
                    /* add the state directly in states */
                    states->tabState[j++] = ctxt->state;
                    ctxt->state = NULL;
                }
            } else {
                if (res == NULL) {
                    /* make it the new container and copy other results */
                    res = ctxt->states;
                    ctxt->states = NULL;
                    for (k = 0; k < j; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            states->tabState[k]);
                } else {
                    /* add all the new results to res and reff the container */
                    for (k = 0; k < ctxt->states->nbState; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            ctxt->states->tabState[k]);
                    xmlRelaxNGFreeStates(ctxt, ctxt->states);
                    ctxt->states = NULL;
                }
            }
        } else {
            if (ctxt->state != NULL) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->state);
                ctxt->state = NULL;
            } else if (ctxt->states != NULL) {
                for (k = 0; k < ctxt->states->nbState; k++)
                    xmlRelaxNGFreeValidState(ctxt,
                                             ctxt->states->tabState[k]);
                xmlRelaxNGFreeStates(ctxt, ctxt->states);
                ctxt->states = NULL;
            }
        }
    }
    ctxt->flags = oldflags;
    if (res != NULL) {
        xmlRelaxNGFreeStates(ctxt, states);
        ctxt->states = res;
        ret = 0;
    } else if (j > 1) {
        states->nbState = j;
        ctxt->states = states;
        ret = 0;
    } else if (j == 1) {
        ctxt->state = states->tabState[0];
        xmlRelaxNGFreeStates(ctxt, states);
        ret = 0;
    } else {
        ret = -1;
        xmlRelaxNGFreeStates(ctxt, states);
        if (ctxt->states != NULL) {
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
    }
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }
    return (ret);
}